

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-split.cpp
# Opt level: O0

void anon_unknown.dwarf_41187::instrumentModule(WasmSplitOptions *options)

{
  long lVar1;
  Fatal *pFVar2;
  const_reference filename;
  Name NVar3;
  string local_7f0;
  undefined1 local_7d0 [8];
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> local_7c8;
  PassOptions local_7c0;
  PassRunner local_708 [8];
  PassRunner runner;
  Name local_618;
  Name local_608;
  undefined1 local_5f8 [8];
  InstrumenterConfig config;
  uint64_t moduleHash;
  Name local_420 [2];
  undefined1 local_400 [8];
  Module wasm;
  WasmSplitOptions *options_local;
  
  wasm.tagsMap._M_h._M_single_bucket = (__node_base_ptr)options;
  ::wasm::Module::Module((Module *)local_400);
  parseInput((Module *)local_400,(WasmSplitOptions *)wasm.tagsMap._M_h._M_single_bucket);
  ::wasm::Name::Name(local_420,(string *)(wasm.tagsMap._M_h._M_single_bucket + 0x36));
  NVar3.super_IString.str._M_str = (char *)local_420[0].super_IString.str._M_len;
  NVar3.super_IString.str._M_len = (size_t)local_400;
  lVar1 = ::wasm::Module::getExportOrNull(NVar3);
  if (lVar1 != 0) {
    ::wasm::Fatal::Fatal((Fatal *)&moduleHash);
    pFVar2 = ::wasm::Fatal::operator<<((Fatal *)&moduleHash,(char (*) [15])"error: Export ");
    pFVar2 = ::wasm::Fatal::operator<<
                       (pFVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (wasm.tagsMap._M_h._M_single_bucket + 0x36));
    ::wasm::Fatal::operator<<(pFVar2,(char (*) [17])" already exists.");
    ::wasm::Fatal::~Fatal((Fatal *)&moduleHash);
  }
  filename = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(wasm.tagsMap._M_h._M_single_bucket + 0x47),0);
  config.profileExport.field_2._8_8_ = hashFile(filename);
  ::wasm::InstrumenterConfig::InstrumenterConfig((InstrumenterConfig *)local_5f8);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 0) {
    ::wasm::Name::Name(&local_608,(string *)(wasm.tagsMap._M_h._M_single_bucket + 0x56));
    ::wasm::Name::operator=((Name *)local_5f8,&local_608);
  }
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 0) {
    ::wasm::Name::Name(&local_618,(string *)(wasm.tagsMap._M_h._M_single_bucket + 0x5e));
    ::wasm::Name::operator=((Name *)&config.importNamespace.super_IString.str._M_str,&local_618);
  }
  config.secondaryMemoryName.super_IString.str._M_str._0_4_ =
       *(undefined4 *)((long)&wasm.tagsMap._M_h._M_single_bucket[0x30]._M_nxt + 4);
  std::__cxx11::string::operator=
            ((string *)&config.storageKind,(string *)(wasm.tagsMap._M_h._M_single_bucket + 0x36));
  ::wasm::PassOptions::PassOptions
            (&local_7c0,(PassOptions *)(wasm.tagsMap._M_h._M_single_bucket + 0x17));
  ::wasm::PassRunner::PassRunner(local_708,(Module *)local_400,&local_7c0);
  ::wasm::PassOptions::~PassOptions(&local_7c0);
  std::make_unique<wasm::Instrumenter,wasm::InstrumenterConfig&,unsigned_long&>
            ((InstrumenterConfig *)local_7d0,(unsigned_long *)local_5f8);
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::Instrumenter,std::default_delete<wasm::Instrumenter>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)&local_7c8,
             (unique_ptr<wasm::Instrumenter,_std::default_delete<wasm::Instrumenter>_> *)local_7d0);
  ::wasm::PassRunner::add(local_708,&local_7c8);
  std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::~unique_ptr(&local_7c8);
  std::unique_ptr<wasm::Instrumenter,_std::default_delete<wasm::Instrumenter>_>::~unique_ptr
            ((unique_ptr<wasm::Instrumenter,_std::default_delete<wasm::Instrumenter>_> *)local_7d0);
  ::wasm::PassRunner::run();
  adjustTableSize((Module *)local_400,*(int *)&wasm.tagsMap._M_h._M_single_bucket[0x6e]._M_nxt,false
                 );
  std::__cxx11::string::string
            ((string *)&local_7f0,(string *)(wasm.tagsMap._M_h._M_single_bucket + 0x4a));
  writeModule((Module *)local_400,&local_7f0,(WasmSplitOptions *)wasm.tagsMap._M_h._M_single_bucket)
  ;
  std::__cxx11::string::~string((string *)&local_7f0);
  ::wasm::PassRunner::~PassRunner(local_708);
  ::wasm::InstrumenterConfig::~InstrumenterConfig((InstrumenterConfig *)local_5f8);
  ::wasm::Module::~Module((Module *)local_400);
  return;
}

Assistant:

void instrumentModule(const WasmSplitOptions& options) {
  Module wasm;
  parseInput(wasm, options);

  // Check that the profile export name is not already taken
  if (wasm.getExportOrNull(options.profileExport) != nullptr) {
    Fatal() << "error: Export " << options.profileExport << " already exists.";
  }

  uint64_t moduleHash = hashFile(options.inputFiles[0]);
  InstrumenterConfig config;
  if (options.importNamespace.size()) {
    config.importNamespace = options.importNamespace;
  }
  if (options.secondaryMemoryName.size()) {
    config.secondaryMemoryName = options.secondaryMemoryName;
  }
  config.storageKind = options.storageKind;
  config.profileExport = options.profileExport;

  PassRunner runner(&wasm, options.passOptions);
  runner.add(std::make_unique<Instrumenter>(config, moduleHash));
  runner.run();

  adjustTableSize(wasm, options.initialTableSize);

  // Write the output modules
  writeModule(wasm, options.output, options);
}